

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O2

int readChecksum(roslz4_stream *str)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  
  pvVar1 = str->state;
  fillUInt32(str,(uint32_t *)((long)pvVar1 + 0x4c),(int *)((long)pvVar1 + 0x50));
  iVar3 = 0;
  if (*(int *)((long)pvVar1 + 0x50) == 4) {
    *(undefined4 *)((long)pvVar1 + 0x20) = 1;
    uVar2 = XXH32_digest(*(void **)((long)pvVar1 + 0x28));
    *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    iVar3 = (uint)(uVar2 == *(uint *)((long)pvVar1 + 0x4c)) * 5 + -3;
  }
  return iVar3;
}

Assistant:

int readChecksum(roslz4_stream *str) {
  stream_state *state = str->state;
  fillUInt32(str, &state->stream_checksum, &state->stream_checksum_read);
  if (state->stream_checksum_read == 4) {
    state->finished = 1;
    state->stream_checksum = readUInt32((unsigned char*)&state->stream_checksum);
    uint32_t checksum = XXH32_digest(state->xxh32_state);
    state->xxh32_state = NULL;
    if (checksum == state->stream_checksum) {
      return ROSLZ4_STREAM_END;
    } else {
      return ROSLZ4_DATA_ERROR;
    }
  }
  return ROSLZ4_OK;
}